

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O0

void draw(void)

{
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4100);
  (*glad_glPushMatrix)();
  (*glad_glRotatef)(view_rotx,1.0,0.0,0.0);
  (*glad_glRotatef)(view_roty,0.0,1.0,0.0);
  (*glad_glRotatef)(view_rotz,0.0,0.0,1.0);
  (*glad_glPushMatrix)();
  (*glad_glTranslatef)(-3.0,-2.0,0.0);
  (*glad_glRotatef)(angle,0.0,0.0,1.0);
  (*glad_glCallList)(gear1);
  (*glad_glPopMatrix)();
  (*glad_glPushMatrix)();
  (*glad_glTranslatef)(3.1,-2.0,0.0);
  (*glad_glRotatef)(-9.0 - (angle + angle),0.0,0.0,1.0);
  (*glad_glCallList)(gear2);
  (*glad_glPopMatrix)();
  (*glad_glPushMatrix)();
  (*glad_glTranslatef)(-3.1,4.2,0.0);
  (*glad_glRotatef)(-25.0 - (angle + angle),0.0,0.0,1.0);
  (*glad_glCallList)(gear3);
  (*glad_glPopMatrix)();
  (*glad_glPopMatrix)();
  return;
}

Assistant:

static void draw(void)
{
  glClearColor(0.0, 0.0, 0.0, 0.0);
  glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  glPushMatrix();
    glRotatef(view_rotx, 1.0, 0.0, 0.0);
    glRotatef(view_roty, 0.0, 1.0, 0.0);
    glRotatef(view_rotz, 0.0, 0.0, 1.0);

    glPushMatrix();
      glTranslatef(-3.0, -2.0, 0.0);
      glRotatef(angle, 0.0, 0.0, 1.0);
      glCallList(gear1);
    glPopMatrix();

    glPushMatrix();
      glTranslatef(3.1f, -2.f, 0.f);
      glRotatef(-2.f * angle - 9.f, 0.f, 0.f, 1.f);
      glCallList(gear2);
    glPopMatrix();

    glPushMatrix();
      glTranslatef(-3.1f, 4.2f, 0.f);
      glRotatef(-2.f * angle - 25.f, 0.f, 0.f, 1.f);
      glCallList(gear3);
    glPopMatrix();

  glPopMatrix();
}